

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,IndexAccessor *accessor,void *data)

{
  IndexAccessor *in_stack_00000028;
  CodeGenerateVisitor *in_stack_00000030;
  
  AccessTableField<luna::IndexAccessor,luna::CodeGenerateVisitor::Visit(luna::IndexAccessor*,void*)::__0>
            (in_stack_00000030,in_stack_00000028,this,accessor._4_4_,
             (anon_class_16_2_2ec09950 *)data);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(IndexAccessor *accessor, void *data)
    {
        AccessTableField(accessor, data, accessor->line_,
                         [=](int key_register) {
                             ExpVarData data{ key_register, key_register + 1 };
                             accessor->index_->Accept(this, &data);
                         });
    }